

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encode<capnp::Text::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Reader local_50;
  
  local_50.field_1.intValue = (int64_t)(value->super_StringPtr).content.ptr;
  local_50.field_1.textValue.super_StringPtr.content.size_ = (value->super_StringPtr).content.size_;
  local_50.type = TEXT;
  encode(__return_storage_ptr__,this,&local_50,(Type)ZEXT816(0xc));
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}